

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

bool __thiscall hdc::Parser::hasParameters(Parser *this)

{
  Token *this_00;
  TokenKind TVar1;
  
  this_00 = (this->current_token)._M_current;
  TVar1 = Token::getKind(this_00);
  if (((TVar1 == TK_AT) && (TVar1 = Token::getKind(this_00 + 1), TVar1 == TK_ID)) &&
     (TVar1 = Token::getKind(this_00 + 2), TVar1 == TK_COLON)) {
    return true;
  }
  return false;
}

Assistant:

bool Parser::hasParameters() {
    std::vector<Token>::iterator it = current_token;

    if ((*it).getKind() == TK_AT) {
        ++it;

        if ((*it).getKind() == TK_ID) {
            ++it;

            if ((*it).getKind() == TK_COLON) {
                return true;
            }
        }
    }

    return false;
}